

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall front::symbol::VoidSymbol::~VoidSymbol(VoidSymbol *this)

{
  void *in_RDI;
  
  ~VoidSymbol((VoidSymbol *)0x29dec8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~VoidSymbol() {}